

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

shared_ptr<ot::commissioner::Commissioner> __thiscall
ot::commissioner::Commissioner::Create(Commissioner *this,CommissionerHandler *aHandler)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ot::commissioner::Commissioner> sVar1;
  undefined1 local_29;
  Commissioner local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28._vptr_Commissioner = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ot::commissioner::CommissionerSafe,std::allocator<ot::commissioner::CommissionerSafe>,ot::commissioner::CommissionerHandler&>
            (a_Stack_20,(CommissionerSafe **)&local_28,
             (allocator<ot::commissioner::CommissionerSafe> *)&local_29,aHandler);
  this->_vptr_Commissioner = (_func_int **)local_28;
  this[1]._vptr_Commissioner = (_func_int **)a_Stack_20[0]._M_pi;
  sVar1.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
  ;
  return (shared_ptr<ot::commissioner::Commissioner>)
         sVar1.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Commissioner> Commissioner::Create(CommissionerHandler &aHandler)
{
    return std::make_shared<CommissionerSafe>(aHandler);
}